

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O0

int SoapySDRDevice_writeGPIODirMasked(SoapySDRDevice *device,char *bank,uint dir,uint mask)

{
  undefined4 in_ECX;
  undefined4 in_EDX;
  char *in_RSI;
  long *in_RDI;
  exception *ex;
  allocator local_41;
  string local_40 [32];
  undefined4 local_20;
  undefined4 local_1c;
  char *local_18;
  long *local_10;
  
  local_20 = in_ECX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  SoapySDRDevice_clearError();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,local_18,&local_41);
  (**(code **)(*local_10 + 0x388))(local_10,local_40,local_1c,local_20);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return 0;
}

Assistant:

int SoapySDRDevice_writeGPIODirMasked(SoapySDRDevice *device, const char *bank, const unsigned dir, const unsigned mask)
{
    __SOAPY_SDR_C_TRY
    device->writeGPIODir(bank, dir, mask);
    __SOAPY_SDR_C_CATCH
}

unsigned SoapySDRDevice_readGPIODir(const SoapySDRDevice *device, const char *bank)
{
    __SOAPY_SDR_C_TRY
    return device->readGPIODir(bank);
    __SOAPY_SDR_C_CATCH
}

/*******************************************************************
 * I2C API
 ******************************************************************/
int SoapySDRDevice_writeI2C(SoapySDRDevice *device, const int addr, const char *data, const size_t numBytes)
{
    __SOAPY_SDR_C_TRY
    device->writeI2C(addr, std::string(data, numBytes));
    __SOAPY_SDR_C_CATCH
}

char *SoapySDRDevice_readI2C(SoapySDRDevice *device, const int addr, size_t *numBytes)
{
    const size_t inputNumBytes = *numBytes;
    *numBytes = 0; //clear in case of error

    __SOAPY_SDR_C_TRY
    const auto bytes = device->readI2C(addr, inputNumBytes);
    char *buff = callocArrayType<char>(bytes.size());
    std::copy(bytes.begin(), bytes.end(), buff);
    *numBytes = bytes.size();
    return buff;
    __SOAPY_SDR_C_CATCH_RET(nullptr);
}

/*******************************************************************
 * SPI API
 ******************************************************************/
unsigned SoapySDRDevice_transactSPI(SoapySDRDevice *device, const int addr, const unsigned data, const size_t numBits)
{
    __SOAPY_SDR_C_TRY
    return device->transactSPI(addr, data, numBits);
    __SOAPY_SDR_C_CATCH
}

/*******************************************************************
 * UART API
 ******************************************************************/
char **SoapySDRDevice_listUARTs(const SoapySDRDevice *device, size_t *length)
{
    *length = 0;
    __SOAPY_SDR_C_TRY
    return toStrArray(device->listUARTs(), length);
    __SOAPY_SDR_C_CATCH_RET(nullptr);
}

int SoapySDRDevice_writeUART(SoapySDRDevice *device, const char *which, const char *data)
{
    __SOAPY_SDR_C_TRY
    device->writeUART(which, data);
    __SOAPY_SDR_C_CATCH
}

char *SoapySDRDevice_readUART(const SoapySDRDevice *device, const char *which, const long timeoutUs)
{
    __SOAPY_SDR_C_TRY
    return toCString(device->readUART(which, timeoutUs));
    __SOAPY_SDR_C_CATCH_RET(nullptr);
}

/*******************************************************************
 * Native Access API
 ******************************************************************/
void* SoapySDRDevice_getNativeDeviceHandle(const SoapySDRDevice *device)
{
    __SOAPY_SDR_C_TRY
    return device->getNativeDeviceHandle();
    __SOAPY_SDR_C_CATCH_RET(nullptr);
}

}